

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

void __thiscall
TElasticity3DAnalytic::graduxy<double>
          (TElasticity3DAnalytic *this,TPZVec<double> *x,TPZFMatrix<double> *grad)

{
  Fad<double> *pFVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint sz;
  ulong uVar5;
  TPZManVector<Fad<double>,_3> result;
  TPZManVector<Fad<double>,_3> xfad;
  undefined1 local_130 [24];
  double local_118;
  TPZManVector<Fad<double>,_3> local_b0;
  
  sz = (uint)x->fNElements;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_b0,(long)(int)sz);
  if (0 < (int)sz) {
    lVar3 = 8;
    lVar2 = 0;
    uVar5 = 0;
    do {
      Fad<double>::Fad((Fad<double> *)local_130,sz,(int)uVar5,(double *)((long)x->fStore + lVar2));
      pFVar1 = local_b0.super_TPZVec<Fad<double>_>.fStore;
      *(undefined8 *)((long)&(local_b0.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar2 * 4) =
           local_130._0_8_;
      Vector<double>::operator=
                ((Vector<double> *)
                 ((long)&(local_b0.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar3),
                 (Vector<double> *)(local_130 + 8));
      *(double *)((long)&pFVar1->defaultVal + lVar2 * 4) = local_118;
      Fad<double>::~Fad((Fad<double> *)local_130);
      uVar5 = uVar5 + 1;
      lVar2 = lVar2 + 8;
      lVar3 = lVar3 + 0x20;
    } while ((sz & 0x7fffffff) != uVar5);
  }
  TPZManVector<Fad<double>,_3>::TPZManVector((TPZManVector<Fad<double>,_3> *)local_130,3);
  uxy<Fad<double>>(this,&local_b0.super_TPZVec<Fad<double>_>,(TPZVec<Fad<double>_> *)local_130);
  (*(grad->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (grad,(long)(int)sz);
  if (0 < (int)sz) {
    lVar2 = 0;
    uVar5 = 0;
    do {
      lVar3 = (grad->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      uVar4 = 0;
      do {
        if ((lVar3 <= (long)uVar4) ||
           ((grad->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)((long)grad->fElem + uVar4 * 8 + lVar2 * lVar3) =
             (((Fad<double> *)(local_130._8_8_ + uVar5 * 0x20))->dx_).ptr_to_data[uVar4];
        uVar4 = uVar4 + 1;
      } while ((sz & 0x7fffffff) != uVar4);
      uVar5 = uVar5 + 1;
      lVar2 = lVar2 + 8;
    } while (uVar5 != (sz & 0x7fffffff));
  }
  TPZManVector<Fad<double>,_3>::~TPZManVector((TPZManVector<Fad<double>,_3> *)local_130);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&local_b0);
  return;
}

Assistant:

void TElasticity3DAnalytic::graduxy(const TPZVec<TVar> &x, TPZFMatrix<TVar> &grad) const
{
    int sz = x.size();
#ifdef PZDEBUG
    if(sz != 3)
    {
        DebugStop();
    }
#endif
    TPZManVector<Fad<TVar>,3> xfad(sz);
    for(int i=0; i<sz; i++)
    {
        Fad<TVar> temp = Fad<TVar>(sz,i,x[i]);
        xfad[i] = temp;
        
    }
    TPZManVector<Fad<TVar>,3> result(3);
    uxy(xfad,result);
    grad.Resize(sz,sz);
    for (int i=0; i<sz; i++) {
        for (int j=0; j<sz; j++)
        {
            grad(j,i) = result[i].d(j);
        }
    }
    
}